

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O2

_Bool player_get_recall_point(player *p)

{
  chunk_conflict **ppcVar1;
  wchar_t wVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = false;
  wVar2 = L'\0';
LAB_001b464d:
  do {
    if (bVar4) {
      p->recall_pt = (int16_t)wVar2;
      return bVar4;
    }
    wVar2 = get_quantity("Which level do you wish to return to (0 to cancel)? ",(int)p->max_depth);
    if (wVar2 == L'\0') {
      return bVar4;
    }
    uVar3 = 0;
    do {
      if (chunk_list_max == uVar3) {
        msg("You must choose a level you have previously visited.");
        goto LAB_001b464d;
      }
      ppcVar1 = chunk_list + uVar3;
      uVar3 = uVar3 + 1;
    } while ((*ppcVar1)->depth != wVar2);
    bVar4 = true;
  } while( true );
}

Assistant:

bool player_get_recall_point(struct player *p)
{
	bool level_ok = false;
	int new = 0;

	while (!level_ok) {
		const char *prompt =
			"Which level do you wish to return to (0 to cancel)? ";
		int i;

		/* Choose the level */
		new = get_quantity(prompt, p->max_depth);
		if (new == 0) {
			return false;
		}

		/* Is that level valid? */
		for (i = 0; i < chunk_list_max; i++) {
			if (chunk_list[i]->depth == new) {
				level_ok = true;
				break;
			}
		}
		if (!level_ok) {
			msg("You must choose a level you have previously visited.");
		}
	}
	p->recall_pt = new;
	return true;
}